

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

int __thiscall HighsMipSolverData::init(HighsMipSolverData *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int iVar2;
  HighsLp *pHVar3;
  HighsMipSolver *pHVar4;
  HighsOptions *pHVar5;
  HighsImplications *init;
  HighsInt HVar6;
  long *plVar7;
  int64_t iVar8;
  int64_t iVar9;
  
  pHVar3 = this->mipsolver->model_;
  presolve::HighsPostsolveStack::initializeIndexMaps
            (&this->postSolveStack,pHVar3->num_row_,pHVar3->num_col_);
  pHVar4 = this->mipsolver;
  pHVar5 = pHVar4->options_mip_;
  pHVar3 = pHVar4->model_;
  pHVar4->orig_model_ = pHVar3;
  this->feastol = (pHVar5->super_HighsOptionsStruct).mip_feasibility_tolerance;
  this->epsilon = (pHVar5->super_HighsOptionsStruct).small_matrix_value;
  if (pHVar4->clqtableinit != (HighsCliqueTable *)0x0) {
    HighsCliqueTable::buildFrom(&this->cliquetable,pHVar3,pHVar4->clqtableinit);
  }
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  plVar7 = (long *)__tls_get_addr(&PTR_00449ef0);
  HVar6 = 0x7fffffff;
  if (1 < *(int *)(*plVar7 + 0x28)) {
    HVar6 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).
            mip_min_cliquetable_entries_for_parallelism;
  }
  (this->cliquetable).minEntriesForParallelism = HVar6;
  init = this->mipsolver->implicinit;
  if (init != (HighsImplications *)0x0) {
    HighsImplications::buildFrom(&this->implications,init);
  }
  pHVar5 = this->mipsolver->options_mip_;
  this->heuristic_effort = (pHVar5->super_HighsOptionsStruct).mip_heuristic_effort;
  this->detectSymmetries = (pHVar5->super_HighsOptionsStruct).mip_detect_symmetry;
  this->firstlpsolobj = -INFINITY;
  this->rootlpsolobj = -INFINITY;
  this->analyticCenterComputed = false;
  this->analyticCenterStatus = kMin;
  this->cliquesExtracted = false;
  this->rowMatrixSet = false;
  this->numRestarts = 0;
  this->numRestartsRoot = 0;
  this->numCliqueEntriesAfterPresolve = 0;
  this->numCliqueEntriesAfterFirstPresolve = 0;
  (this->pruned_treeweight).lo = 0.0;
  this->avgrootlpiters = 0.0;
  *(undefined8 *)&this->maxTreeSizeLog2 = 0;
  *(undefined8 *)((long)&(this->pruned_treeweight).hi + 4) = 0;
  memset(&this->num_nodes,0,0x84);
  this->lower_bound = -INFINITY;
  this->upper_bound = INFINITY;
  dVar1 = (pHVar5->super_HighsOptionsStruct).objective_bound;
  this->upper_limit = dVar1;
  this->optimality_limit = dVar1;
  (this->primal_dual_integral).value = -INFINITY;
  iVar2 = (pHVar5->super_HighsOptionsStruct).mip_report_level;
  iVar8 = 100;
  if (iVar2 == 1) {
    iVar8 = 2000;
  }
  iVar9 = 0;
  if (iVar2 != 0) {
    iVar9 = iVar8;
  }
  this->dispfreq = iVar9;
  return iVar2;
}

Assistant:

void HighsMipSolverData::init() {
  postSolveStack.initializeIndexMaps(mipsolver.model_->num_row_,
                                     mipsolver.model_->num_col_);
  mipsolver.orig_model_ = mipsolver.model_;
  feastol = mipsolver.options_mip_->mip_feasibility_tolerance;
  epsilon = mipsolver.options_mip_->small_matrix_value;
  if (mipsolver.clqtableinit)
    cliquetable.buildFrom(mipsolver.orig_model_, *mipsolver.clqtableinit);
  cliquetable.setMinEntriesForParallelism(
      highs::parallel::num_threads() > 1
          ? mipsolver.options_mip_->mip_min_cliquetable_entries_for_parallelism
          : kHighsIInf);
  if (mipsolver.implicinit) implications.buildFrom(*mipsolver.implicinit);
  heuristic_effort = mipsolver.options_mip_->mip_heuristic_effort;
  detectSymmetries = mipsolver.options_mip_->mip_detect_symmetry;

  firstlpsolobj = -kHighsInf;
  rootlpsolobj = -kHighsInf;
  analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  maxTreeSizeLog2 = 0;
  numRestarts = 0;
  numRestartsRoot = 0;
  numImprovingSols = 0;
  pruned_treeweight = 0;
  avgrootlpiters = 0;
  num_nodes = 0;
  num_nodes_before_run = 0;
  num_leaves = 0;
  num_leaves_before_run = 0;
  total_repair_lp = 0;
  total_repair_lp_feasible = 0;
  total_repair_lp_iterations = 0;
  total_lp_iterations = 0;
  heuristic_lp_iterations = 0;
  sepa_lp_iterations = 0;
  sb_lp_iterations = 0;
  total_lp_iterations_before_run = 0;
  heuristic_lp_iterations_before_run = 0;
  sepa_lp_iterations_before_run = 0;
  sb_lp_iterations_before_run = 0;
  num_disp_lines = 0;
  numCliqueEntriesAfterPresolve = 0;
  numCliqueEntriesAfterFirstPresolve = 0;
  cliquesExtracted = false;
  rowMatrixSet = false;
  lower_bound = -kHighsInf;
  upper_bound = kHighsInf;
  upper_limit = mipsolver.options_mip_->objective_bound;
  optimality_limit = mipsolver.options_mip_->objective_bound;
  primal_dual_integral.initialise();

  if (mipsolver.options_mip_->mip_report_level == 0)
    dispfreq = 0;
  else if (mipsolver.options_mip_->mip_report_level == 1)
    dispfreq = 2000;
  else
    dispfreq = 100;
}